

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O0

void __thiscall
llm_build_plm::llm_build_plm
          (llm_build_plm *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  uint uVar1;
  undefined4 uVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  ggml_tensor *pgVar6;
  ggml_tensor *pgVar7;
  ggml_tensor *pgVar8;
  const_reference pvVar9;
  undefined4 *puVar10;
  undefined8 uVar11;
  int extraout_var;
  undefined8 uVar12;
  int extraout_var_00;
  ggml_tensor *pgVar13;
  llm_graph_input_attn_kv_unified *inp;
  undefined8 uVar14;
  ggml_tensor *pgVar15;
  ggml_cgraph *pgVar16;
  ggml_tensor *pgVar17;
  int extraout_var_01;
  void *pvVar18;
  undefined8 uVar19;
  int extraout_var_02;
  undefined8 uVar20;
  undefined8 uVar21;
  ggml_backend_buffer *name;
  ggml_tensor *pgVar22;
  ggml_tensor *pgVar23;
  pointer plVar24;
  ggml_tensor *in_RCX;
  ggml_tensor *v_mla;
  ggml_tensor *kq_b;
  long in_RSI;
  ggml_tensor *q_cur;
  long in_RDI;
  ggml_tensor *ffn_inp;
  ggml_tensor *inp_out_ids;
  ggml_tensor *k_states;
  ggml_tensor *q_states;
  ggml_tensor *v_states;
  ggml_tensor *k_nope;
  ggml_tensor *kv;
  ggml_tensor *k_pe;
  ggml_tensor *kv_compressed;
  ggml_tensor *kv_pe_compresseed;
  ggml_tensor *q_pe;
  ggml_tensor *q_nope;
  ggml_tensor *q;
  ggml_tensor *inpSA;
  int il;
  llm_graph_input_attn_kv_unified *inp_attn;
  ggml_tensor *inp_pos;
  ggml_tensor *inpL;
  ggml_tensor *cur;
  uint32_t kv_lora_rank;
  uint32_t n_embd_head_qk_nope;
  uint32_t n_embd_head_qk_rope;
  float kq_scale;
  ggml_tensor *in_stack_fffffffffffffc08;
  int iVar26;
  size_t sVar25;
  int iVar27;
  int il_00;
  llm_graph_context *in_stack_fffffffffffffc10;
  ggml_backend_buffer *pgVar28;
  ggml_tensor *in_stack_fffffffffffffc18;
  ggml_tensor *cur_00;
  ggml_tensor *in_stack_fffffffffffffc20;
  ggml_tensor *mw;
  ggml_tensor *in_stack_fffffffffffffc28;
  undefined4 uVar29;
  ggml_tensor *cur_01;
  llm_graph_context *in_stack_fffffffffffffc30;
  llm_graph_context *in_stack_fffffffffffffc60;
  ggml_tensor *in_stack_fffffffffffffc68;
  llm_graph_context *in_stack_fffffffffffffc70;
  ggml_tensor *in_stack_fffffffffffffca0;
  ggml_tensor *pgVar30;
  ggml_tensor *in_stack_fffffffffffffcb0;
  ggml_tensor *in_stack_fffffffffffffcc0;
  ggml_tensor *in_stack_fffffffffffffcc8;
  ggml_tensor *in_stack_fffffffffffffcd0;
  ggml_tensor *down_s;
  llm_ffn_op_type type_op;
  llm_ffn_gate_type type_gate;
  size_t sVar31;
  ggml_tensor *in_stack_fffffffffffffd18;
  llm_graph_context *in_stack_fffffffffffffd20;
  float kq_scale_00;
  ggml_cgraph *gf_00;
  int il_01;
  size_t sVar32;
  ggml_tensor *local_70;
  int local_64;
  ggml_tensor *local_40;
  ggml_tensor *local_38;
  
  llm_graph_context::llm_graph_context
            ((llm_graph_context *)in_stack_fffffffffffffc20,
             (llm_graph_params *)in_stack_fffffffffffffc18);
  sqrtf((float)*(uint *)(*(long *)(in_RDI + 8) + 0x20));
  uVar1 = *(uint *)(*(long *)(in_RDI + 8) + 0x14);
  iVar5 = *(int *)(*(long *)(in_RDI + 8) + 0x20) - *(int *)(*(long *)(in_RDI + 8) + 0x14);
  uVar2 = *(undefined4 *)(*(long *)(in_RDI + 8) + 0x1854);
  local_40 = llm_graph_context::build_inp_embd(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  pgVar6 = llm_graph_context::build_inp_pos(in_stack_fffffffffffffc70);
  pgVar7 = (ggml_tensor *)
           llm_graph_context::build_attn_inp_kv_unified
                     ((llm_graph_context *)in_stack_fffffffffffffcb0);
  for (local_64 = 0; iVar27 = (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),
      (long)local_64 < *(long *)(in_RDI + 0x28); local_64 = local_64 + 1) {
    local_70 = local_40;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)local_64
              );
    pgVar8 = llm_graph_context::build_norm
                       (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
                        in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
                        (llm_norm_type)((ulong)in_stack_fffffffffffffc10 >> 0x20),
                        (int)in_stack_fffffffffffffc10);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
               (char *)in_stack_fffffffffffffc10,iVar27);
    uVar20 = *(undefined8 *)(in_RDI + 0xc0);
    pvVar9 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)local_64);
    puVar10 = (undefined4 *)ggml_mul_mat(uVar20,pvVar9->wq,pgVar8);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
               (char *)in_stack_fffffffffffffc10,iVar27);
    uVar20 = *(undefined8 *)(in_RDI + 0xc0);
    uVar21 = *(undefined8 *)(in_RDI + 0x48);
    iVar27 = *(int *)(in_RDI + 0xa8);
    uVar11 = ggml_row_size(*puVar10,*(undefined4 *)(*(long *)(in_RDI + 8) + 0x20));
    ggml_row_size(*puVar10,(ulong)*(uint *)(*(long *)(in_RDI + 8) + 0x20) * *(long *)(in_RDI + 0x48)
                 );
    pgVar28 = (ggml_backend_buffer *)0x0;
    iVar26 = extraout_var;
    uVar11 = ggml_view_3d(uVar20,puVar10,iVar5,uVar21,(long)iVar27,uVar11);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
               (char *)pgVar28,iVar26);
    uVar20 = *(undefined8 *)(in_RDI + 0xc0);
    uVar21 = *(undefined8 *)(in_RDI + 0x48);
    iVar27 = *(int *)(in_RDI + 0xa8);
    uVar12 = ggml_row_size(*puVar10,*(undefined4 *)(*(long *)(in_RDI + 8) + 0x20));
    ggml_row_size(*puVar10,(ulong)*(uint *)(*(long *)(in_RDI + 8) + 0x20) * *(long *)(in_RDI + 0x48)
                 );
    pgVar28 = (ggml_backend_buffer *)ggml_row_size(*puVar10,iVar5);
    iVar26 = extraout_var_00;
    uVar12 = ggml_view_3d(uVar20,puVar10,uVar1,uVar21,(long)iVar27,uVar12);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
               (char *)pgVar28,iVar26);
    uVar20 = *(undefined8 *)(in_RDI + 0xc0);
    pvVar9 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)local_64);
    pgVar13 = (ggml_tensor *)ggml_mul_mat(uVar20,pvVar9->wkv_a_mqa,pgVar8);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
               (char *)pgVar28,iVar26);
    inp = (llm_graph_input_attn_kv_unified *)
          ggml_view_2d(*(undefined8 *)(in_RDI + 0xc0),pgVar13,uVar2,(long)*(int *)(in_RDI + 0xa8),
                       pgVar13->nb[1],0);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
               (char *)pgVar28,iVar26);
    pgVar8 = *(ggml_tensor **)(in_RDI + 0xc0);
    kq_b = (ggml_tensor *)(ulong)uVar1;
    v_mla = (ggml_tensor *)(long)*(int *)(in_RDI + 0xa8);
    sVar31 = pgVar13->nb[1];
    sVar25 = sVar31;
    pgVar28 = (ggml_backend_buffer *)ggml_row_size(pgVar13->type,uVar2);
    sVar32 = sVar25;
    uVar14 = ggml_view_3d(pgVar8,pgVar13,kq_b,1,v_mla,sVar31);
    il_01 = (int)sVar32;
    iVar27 = (int)(sVar25 >> 0x20);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
               (char *)pgVar28,iVar27);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)local_64
              );
    pgVar15 = llm_graph_context::build_norm
                        (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
                         in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
                         (llm_norm_type)((ulong)pgVar28 >> 0x20),(int)pgVar28);
    uVar29 = (undefined4)((ulong)in_stack_fffffffffffffc28 >> 0x20);
    pgVar30 = pgVar15;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
               (char *)pgVar28,iVar27);
    pgVar23 = *(ggml_tensor **)(in_RDI + 0xc0);
    pvVar9 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)local_64);
    pgVar16 = (ggml_cgraph *)ggml_mul_mat(pgVar23,pvVar9->wkv_b,pgVar15);
    gf_00 = pgVar16;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
               (char *)pgVar28,iVar27);
    uVar20 = *(undefined8 *)(in_RDI + 0xc0);
    uVar21 = *(undefined8 *)(in_RDI + 0x48);
    q_cur = (ggml_tensor *)(long)*(int *)(in_RDI + 0xa8);
    pgVar17 = (ggml_tensor *)
              ggml_row_size(*(undefined4 *)pgVar16,iVar5 + *(int *)(*(long *)(in_RDI + 8) + 0x24));
    ggml_row_size(*(undefined4 *)pgVar16,
                  *(long *)(in_RDI + 0x48) *
                  (ulong)(uint)(iVar5 + *(int *)(*(long *)(in_RDI + 8) + 0x24)));
    pgVar28 = (ggml_backend_buffer *)0x0;
    iVar27 = extraout_var_01;
    pvVar18 = (void *)ggml_view_3d(uVar20,pgVar16,iVar5,uVar21,q_cur,pgVar17);
    kq_scale_00 = (float)((ulong)uVar21 >> 0x20);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
               (char *)pgVar28,iVar27);
    uVar20 = *(undefined8 *)(in_RDI + 0xc0);
    uVar21 = *(undefined8 *)(in_RDI + 0x48);
    iVar27 = *(int *)(*(long *)(in_RDI + 8) + 0x24);
    iVar26 = *(int *)(in_RDI + 0xa8);
    uVar19 = ggml_row_size(*(undefined4 *)pgVar16,iVar5 + iVar27);
    ggml_row_size(*(undefined4 *)pgVar16,
                  (ulong)(uint)(iVar5 + *(int *)(*(long *)(in_RDI + 8) + 0x24)) *
                  *(long *)(in_RDI + 0x48));
    pgVar28 = (ggml_backend_buffer *)ggml_row_size(*(undefined4 *)pgVar16,iVar5);
    il_00 = extraout_var_02;
    uVar20 = ggml_view_3d(uVar20,pgVar16,iVar27,uVar21,(long)iVar26,uVar19);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
               (char *)pgVar28,il_00);
    uVar21 = ggml_cont(*(undefined8 *)(in_RDI + 0xc0),uVar20);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
               (char *)pgVar28,il_00);
    uVar20 = *(undefined8 *)(in_RDI + 0xc0);
    lVar4 = *(long *)(in_RDI + 0x48);
    uVar3 = *(uint *)(*(long *)(in_RDI + 8) + 0x24);
    iVar27 = *(int *)(in_RDI + 0xa8);
    uVar19 = ggml_row_size(*(undefined4 *)pgVar16);
    name = (ggml_backend_buffer *)
           ggml_view_2d(uVar20,uVar21,(ulong)uVar3 * lVar4,(long)iVar27,uVar19,0);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
               (char *)pgVar28,il_00);
    uVar20 = ggml_rope_ext(*(undefined4 *)(in_RDI + 0x88),*(undefined4 *)(in_RDI + 0x8c),
                           *(undefined4 *)(in_RDI + 0x90),*(undefined4 *)(in_RDI + 0x94),
                           *(undefined4 *)(in_RDI + 0x98),*(undefined4 *)(in_RDI + 0x9c),
                           *(undefined8 *)(in_RDI + 0xc0),uVar12,pgVar6,0,
                           *(undefined4 *)(in_RDI + 0x30),*(undefined4 *)(in_RDI + 0xb8));
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
               (char *)pgVar28,il_00);
    uVar21 = ggml_rope_ext(*(undefined4 *)(in_RDI + 0x88),*(undefined4 *)(in_RDI + 0x8c),
                           *(undefined4 *)(in_RDI + 0x90),*(undefined4 *)(in_RDI + 0x94),
                           *(undefined4 *)(in_RDI + 0x98),*(undefined4 *)(in_RDI + 0x9c),
                           *(undefined8 *)(in_RDI + 0xc0),uVar14,pgVar6,0,
                           *(undefined4 *)(in_RDI + 0x30),*(undefined4 *)(in_RDI + 0xb8));
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
               (char *)pgVar28,il_00);
    ggml_concat(*(undefined8 *)(in_RDI + 0xc0),uVar11,uVar20,0);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
               (char *)pgVar28,il_00);
    sVar31 = *(size_t *)(in_RDI + 0xc0);
    uVar20 = ggml_repeat(sVar31,uVar21,uVar20);
    pgVar22 = (ggml_tensor *)ggml_concat(sVar31,pvVar18,uVar20,0);
    iVar26 = (int)pvVar18;
    type_gate = (llm_ffn_gate_type)sVar31;
    pgVar15 = pgVar22;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
               (char *)pgVar28,il_00);
    type_op = (llm_ffn_op_type)pgVar15;
    pgVar15 = pgVar7;
    down_s = in_RCX;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)local_64
              );
    cur_01 = (ggml_tensor *)CONCAT44(uVar29,local_64);
    mw = (ggml_tensor *)0x0;
    cur_00 = (ggml_tensor *)0x0;
    local_38 = llm_graph_context::build_attn
                         ((llm_graph_context *)pgVar30,inp,gf_00,pgVar23,pgVar17,q_cur,pgVar8,
                          pgVar13,kq_b,v_mla,kq_scale_00,il_01);
    iVar27 = (int)((ulong)pgVar22 >> 0x20);
    pgVar8 = local_38;
    if ((long)local_64 == *(long *)(in_RDI + 0x28) + -1) {
      pgVar23 = llm_graph_context::build_inp_out_ids(in_stack_fffffffffffffc60);
      in_stack_fffffffffffffcd0 = pgVar23;
      local_38 = (ggml_tensor *)ggml_get_rows(*(undefined8 *)(in_RDI + 0xc0),local_38,pgVar23);
      in_stack_fffffffffffffcc8 = local_38;
      in_stack_fffffffffffffcc0 =
           (ggml_tensor *)ggml_get_rows(*(undefined8 *)(in_RDI + 0xc0),local_40,pgVar23);
      local_70 = in_stack_fffffffffffffcc0;
    }
    pgVar17 = (ggml_tensor *)ggml_add(*(undefined8 *)(in_RDI + 0xc0),local_38,local_70);
    llm_graph_context::cb((llm_graph_context *)mw,cur_00,(char *)name,iVar27);
    pgVar30 = pgVar17;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)local_64
              );
    pgVar22 = llm_graph_context::build_norm
                        (in_stack_fffffffffffffc30,cur_01,mw,cur_00,
                         (llm_norm_type)((ulong)name >> 0x20),(int)name);
    pgVar13 = pgVar22;
    llm_graph_context::cb((llm_graph_context *)mw,cur_00,(char *)name,iVar27);
    pvVar9 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)local_64);
    pgVar23 = pvVar9->ffn_up;
    pvVar9 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)local_64);
    in_stack_fffffffffffffc18 = pvVar9->ffn_down;
    in_stack_fffffffffffffc30 = (llm_graph_context *)0x0;
    in_stack_fffffffffffffc28 = (ggml_tensor *)0x0;
    in_stack_fffffffffffffc20 = (ggml_tensor *)0x0;
    in_stack_fffffffffffffc10 = (llm_graph_context *)0x0;
    in_stack_fffffffffffffc08 = (ggml_tensor *)0x0;
    pgVar8 = llm_graph_context::build_ffn
                       ((llm_graph_context *)pgVar13,pgVar30,in_stack_fffffffffffffca0,
                        (ggml_tensor *)&stack0xfffffffffffffc08,pgVar23,pgVar22,
                        in_stack_fffffffffffffcc0,in_stack_fffffffffffffcc8,
                        in_stack_fffffffffffffcd0,pgVar15,down_s,pgVar8,type_op,type_gate,iVar26);
    in_stack_fffffffffffffca0 = pgVar8;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
               (char *)in_stack_fffffffffffffc10,(int)((ulong)in_stack_fffffffffffffc08 >> 0x20));
    ggml_add(*(undefined8 *)(in_RDI + 0xc0),pgVar8,pgVar17);
    local_40 = llm_graph_context::build_cvec(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,0);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
               (char *)in_stack_fffffffffffffc10,(int)((ulong)in_stack_fffffffffffffc08 >> 0x20));
  }
  pgVar7 = llm_graph_context::build_norm
                     (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,
                      in_stack_fffffffffffffc18,
                      (llm_norm_type)((ulong)in_stack_fffffffffffffc10 >> 0x20),
                      (int)in_stack_fffffffffffffc10);
  pgVar6 = pgVar7;
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
             (char *)in_stack_fffffffffffffc10,iVar27);
  plVar24 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                      ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                       0x501f58);
  plVar24->t_embd = pgVar7;
  pgVar6 = llm_graph_context::build_lora_mm
                     ((llm_graph_context *)pgVar6,in_stack_fffffffffffffc68,pgVar7);
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
             (char *)in_stack_fffffffffffffc10,iVar27);
  plVar24 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                      ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                       0x501fdd);
  plVar24->t_logits = pgVar6;
  ggml_build_forward_expand(in_RCX,pgVar6);
  return;
}

Assistant:

llm_build_plm(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_graph_context(params) {
        const float kq_scale = 1.0f/sqrtf(float(hparams.n_embd_head_k));

        const uint32_t n_embd_head_qk_rope = hparams.n_rot;
        const uint32_t n_embd_head_qk_nope = hparams.n_embd_head_k - hparams.n_rot;
        const uint32_t kv_lora_rank = hparams.n_lora_kv;

        ggml_tensor * cur;
        ggml_tensor * inpL;

        // {n_embd, n_tokens}
        inpL = build_inp_embd(model.tok_embd);

        // inp_pos - contains the positions
        ggml_tensor * inp_pos = build_inp_pos();

        auto * inp_attn = build_attn_inp_kv_unified();

        for (int il = 0; il < n_layer; ++il) {
            ggml_tensor * inpSA = inpL;

            // norm
            cur = build_norm(inpL,
                    model.layers[il].attn_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "attn_norm", il);

            // self_attention
            {
                ggml_tensor * q = NULL;
                q = ggml_mul_mat(ctx0, model.layers[il].wq, cur);
                cb(q, "q", il);

                // split into {n_head * n_embd_head_qk_nope, n_tokens}
                ggml_tensor * q_nope = ggml_view_3d(ctx0, q, n_embd_head_qk_nope, n_head, n_tokens,
                        ggml_row_size(q->type, hparams.n_embd_head_k),
                        ggml_row_size(q->type, hparams.n_embd_head_k * n_head),
                        0);
                cb(q_nope, "q_nope", il);

                // and {n_head * n_embd_head_qk_rope, n_tokens}
                ggml_tensor * q_pe = ggml_view_3d(ctx0, q, n_embd_head_qk_rope, n_head, n_tokens,
                        ggml_row_size(q->type, hparams.n_embd_head_k),
                        ggml_row_size(q->type, hparams.n_embd_head_k * n_head),
                        ggml_row_size(q->type, n_embd_head_qk_nope));
                cb(q_pe, "q_pe", il);

                // {n_embd, kv_lora_rank + n_embd_head_qk_rope} * {n_embd, n_tokens} -> {kv_lora_rank + n_embd_head_qk_rope, n_tokens}
                ggml_tensor * kv_pe_compresseed = ggml_mul_mat(ctx0, model.layers[il].wkv_a_mqa, cur);
                cb(kv_pe_compresseed, "kv_pe_compresseed", il);

                // split into {kv_lora_rank, n_tokens}
                ggml_tensor * kv_compressed = ggml_view_2d(ctx0, kv_pe_compresseed, kv_lora_rank, n_tokens,
                        kv_pe_compresseed->nb[1],
                        0);
                cb(kv_compressed, "kv_compressed", il);

                // and {n_embd_head_qk_rope, n_tokens}
                ggml_tensor * k_pe = ggml_view_3d(ctx0, kv_pe_compresseed, n_embd_head_qk_rope, 1, n_tokens,
                        kv_pe_compresseed->nb[1],
                        kv_pe_compresseed->nb[1],
                        ggml_row_size(kv_pe_compresseed->type, kv_lora_rank));
                cb(k_pe, "k_pe", il);

                kv_compressed = build_norm(kv_compressed,
                        model.layers[il].attn_kv_a_norm, NULL,
                        LLM_NORM_RMS, il);
                cb(kv_compressed, "kv_compressed", il);

                // {kv_lora_rank, n_head * (n_embd_head_qk_nope + n_embd_head_v)} * {kv_lora_rank, n_tokens} -> {n_head * (n_embd_head_qk_nope + n_embd_head_v), n_tokens}
                ggml_tensor * kv = ggml_mul_mat(ctx0, model.layers[il].wkv_b, kv_compressed);
                cb(kv, "kv", il);

                // split into {n_head * n_embd_head_qk_nope, n_tokens}
                ggml_tensor * k_nope = ggml_view_3d(ctx0, kv, n_embd_head_qk_nope, n_head, n_tokens,
                        ggml_row_size(kv->type, n_embd_head_qk_nope + hparams.n_embd_head_v),
                        ggml_row_size(kv->type, n_head * (n_embd_head_qk_nope + hparams.n_embd_head_v)),
                        0);
                cb(k_nope, "k_nope", il);

                // and {n_head * n_embd_head_v, n_tokens}
                ggml_tensor * v_states = ggml_view_3d(ctx0, kv, hparams.n_embd_head_v, n_head, n_tokens,
                        ggml_row_size(kv->type, (n_embd_head_qk_nope + hparams.n_embd_head_v)),
                        ggml_row_size(kv->type, (n_embd_head_qk_nope + hparams.n_embd_head_v)*n_head),
                        ggml_row_size(kv->type, (n_embd_head_qk_nope)));
                cb(v_states, "v_states", il);

                v_states = ggml_cont(ctx0, v_states);
                cb(v_states, "v_states", il);

                v_states = ggml_view_2d(ctx0, v_states, hparams.n_embd_head_v * n_head, n_tokens,
                        ggml_row_size(kv->type, hparams.n_embd_head_v * n_head),
                        0);
                cb(v_states, "v_states", il);

                q_pe = ggml_rope_ext(
                        ctx0, q_pe, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );
                cb(q_pe, "q_pe", il);

                // shared RoPE key
                k_pe = ggml_rope_ext(
                        ctx0, k_pe, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );
                cb(k_pe, "k_pe", il);

                ggml_tensor * q_states = ggml_concat(ctx0, q_nope, q_pe, 0);
                cb(q_states, "q_states", il);

                ggml_tensor * k_states = ggml_concat(ctx0, k_nope, ggml_repeat(ctx0, k_pe, q_pe), 0);
                cb(k_states, "k_states", il);

                cur = build_attn(inp_attn, gf,
                        model.layers[il].wo, NULL,
                        q_states, k_states, v_states, nullptr, nullptr, kq_scale, il);
            }

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                ggml_tensor * inp_out_ids = build_inp_out_ids();
                cur   = ggml_get_rows(ctx0,   cur, inp_out_ids);
                inpSA = ggml_get_rows(ctx0, inpSA, inp_out_ids);
            }

            ggml_tensor * ffn_inp = ggml_add(ctx0, cur, inpSA);
            cb(ffn_inp, "ffn_inp", il);

            cur = build_norm(ffn_inp,
                    model.layers[il].ffn_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "ffn_norm", il);

            cur = build_ffn(cur,
                    model.layers[il].ffn_up,   NULL, NULL,
                    NULL, NULL, NULL,
                    model.layers[il].ffn_down, NULL, NULL,
                    NULL,
                    LLM_FFN_RELU_SQR, LLM_FFN_SEQ, il);
            cb(cur, "ffn_out", il);

            cur = ggml_add(ctx0, cur, ffn_inp);

            cur = build_cvec(cur, il);
            cb(cur, "l_out", il);

            // input for next layer
            inpL = cur;
        }

        cur = inpL;

        cur = build_norm(cur,
                model.output_norm, NULL,
                LLM_NORM_RMS, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        cur = build_lora_mm(model.output, cur);

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }